

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::processLocalQuery(CoreBroker *this,ActionMessage *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider __src;
  size_t sVar2;
  int iVar3;
  mapped_type *pmVar4;
  action_t startingAction;
  size_type __rlen;
  bool force_ordering;
  string_view request;
  ActionMessage queryRep;
  string local_108;
  ActionMessage local_e8;
  
  force_ordering = (message->messageAction & cmd_priority_disconnect) == cmd_query_ordered;
  startingAction = cmd_query_reply;
  if (force_ordering) {
    startingAction = cmd_query_reply_ordered;
  }
  ActionMessage::ActionMessage(&local_e8,startingAction);
  local_e8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  local_e8.dest_id.gid = (message->source_id).gid;
  local_e8.messageID = message->messageID;
  request._M_str = (char *)(message->payload).heap;
  request._M_len = (message->payload).bufferSize;
  generateQueryAnswer_abi_cxx11_(&local_108,this,request,force_ordering);
  local_e8.payload.bufferSize = local_108._M_string_length;
  __src._M_p = local_108._M_dataplus._M_p;
  if ((byte *)local_108._M_dataplus._M_p == local_e8.payload.heap) {
  }
  else {
    SmallBuffer::reserve(&local_e8.payload,local_108._M_string_length);
    if ((byte *)local_e8.payload.bufferSize != (byte *)0x0) {
      memcpy(local_e8.payload.heap,__src._M_p,local_e8.payload.bufferSize);
    }
  }
  paVar1 = &local_108.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  sVar2 = local_e8.payload.bufferSize;
  local_e8.counter = message->counter;
  if ((byte *)local_e8.payload.bufferSize == (byte *)0x5) {
    iVar3 = bcmp(local_e8.payload.heap,"#wait",5);
    if (iVar3 == 0) {
      if (local_e8.dest_id.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
        if ((this->queryTimeouts).
            super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->queryTimeouts).
            super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,true);
        }
        local_108._M_dataplus._M_p = (pointer)std::chrono::_V2::steady_clock::now();
        std::
        deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
        ::
        emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  ((deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                    *)&this->queryTimeouts,&local_e8.messageID,
                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&local_108);
      }
      local_108._M_dataplus._M_p = (pointer)(message->payload).bufferSize;
      local_108._M_string_length = (size_type)(message->payload).heap;
      pmVar4 = std::
               map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
               ::at((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                     *)mapIndex,(key_type *)&local_108);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                 ((long)&(((this->mapBuilders).
                           super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                         ).
                         super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                         .
                         super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                 + (ulong)((uint)pmVar4->first * 0x60)),&local_e8);
      goto LAB_002f56b4;
    }
  }
  if (local_e8.dest_id.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
    iVar3 = message->messageID;
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,local_e8.payload.heap,
               (byte *)(sVar2 + (long)local_e8.payload.heap));
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,iVar3,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    routeMessage(this,&local_e8,(GlobalFederateId)(message->source_id).gid);
  }
LAB_002f56b4:
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void CoreBroker::processLocalQuery(const ActionMessage& message)
{
    const bool force_ordered =
        (message.action() == CMD_QUERY_ORDERED || message.action() == CMD_BROKER_QUERY_ORDERED);
    ActionMessage queryRep(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
    queryRep.source_id = global_broker_id_local;
    queryRep.dest_id = message.source_id;
    queryRep.messageID = message.messageID;
    queryRep.payload = generateQueryAnswer(message.payload.to_string(), force_ordered);
    queryRep.counter = message.counter;
    if (queryRep.payload.to_string() == "#wait") {
        if (queryRep.dest_id == global_broker_id_local) {
            if (queryTimeouts.empty()) {
                setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
            }
            queryTimeouts.emplace_back(queryRep.messageID, std::chrono::steady_clock::now());
        }
        std::get<1>(mapBuilders[mapIndex.at(message.payload.to_string()).first])
            .push_back(queryRep);
    } else if (queryRep.dest_id == global_broker_id_local) {
        activeQueries.setDelayedValue(message.messageID, std::string(queryRep.payload.to_string()));
    } else {
        routeMessage(std::move(queryRep), message.source_id);
    }
}